

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O2

int __thiscall
DIS::ElectromagneticEmissionsPdu::getMarshalledSize(ElectromagneticEmissionsPdu *this)

{
  pointer pEVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ElectromagneticEmissionSystemData listElement;
  
  iVar2 = DistributedEmissionsFamilyPdu::getMarshalledSize
                    (&this->super_DistributedEmissionsFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_emittingEntityID);
  iVar4 = EventIdentifier::getMarshalledSize(&this->_eventID);
  iVar2 = iVar4 + iVar3 + iVar2 + 4;
  lVar6 = 0;
  for (uVar5 = 0;
      pEVar1 = (this->_systems).
               super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(this->_systems).
                             super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x50);
      uVar5 = uVar5 + 1) {
    ElectromagneticEmissionSystemData::ElectromagneticEmissionSystemData
              (&listElement,
               (ElectromagneticEmissionSystemData *)
               ((long)&pEVar1->_vptr_ElectromagneticEmissionSystemData + lVar6));
    iVar3 = ElectromagneticEmissionSystemData::getMarshalledSize(&listElement);
    iVar2 = iVar2 + iVar3;
    ElectromagneticEmissionSystemData::~ElectromagneticEmissionSystemData(&listElement);
    lVar6 = lVar6 + 0x50;
  }
  return iVar2;
}

Assistant:

int ElectromagneticEmissionsPdu::getMarshalledSize() const
{
    int marshalSize = 0;

    marshalSize = DistributedEmissionsFamilyPdu::getMarshalledSize();
    marshalSize = marshalSize + _emittingEntityID.getMarshalledSize();  // _emittingEntityID
    marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
    marshalSize = marshalSize + 1;  // _stateUpdateIndicator
    marshalSize = marshalSize + 1;  // _numberOfSystems
    marshalSize = marshalSize + 2;  // _paddingForEmissionsPdu    

    for(unsigned long long idx=0; idx < _systems.size(); idx++)
    {
        ElectromagneticEmissionSystemData listElement = _systems[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}